

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O1

int size_tToString(char *destination,size_t destinationSize,size_t value)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar3 = 0x32e;
  if (1 < destinationSize && destination != (char *)0x0) {
    pcVar7 = destination + -1;
    uVar8 = 0xffffffffffffffff;
    do {
      pcVar6 = pcVar7;
      uVar5 = value;
      pcVar6[1] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
      pcVar7 = pcVar6 + 1;
      uVar1 = uVar8 + 1;
      if (uVar5 < 10) break;
      uVar9 = uVar8 + 2;
      value = uVar5 / 10;
      uVar8 = uVar1;
    } while (uVar9 < destinationSize - 1);
    iVar3 = 0x34b;
    if (uVar5 < 10) {
      pcVar6[2] = '\0';
      iVar3 = 0;
      lVar4 = 0;
      do {
        cVar2 = destination[lVar4];
        destination[lVar4] = *pcVar7;
        *pcVar7 = cVar2;
        lVar4 = lVar4 + 1;
        pcVar7 = pcVar7 + -1;
      } while ((uVar1 >> 1) + 1 != lVar4);
    }
  }
  return iVar3;
}

Assistant:

int size_tToString(char* destination, size_t destinationSize, size_t value)
{
    int result;
    size_t pos;
    /*the below loop gets the number in reverse order*/
    /*Codes_SRS_CRT_ABSTRACTIONS_02_003: [If destination is NULL then unsignedIntToString shall fail.] */
    /*Codes_SRS_CRT_ABSTRACTIONS_02_002: [If the conversion fails for any reason (for example, insufficient buffer space), a non-zero return value shall be supplied and unsignedIntToString shall fail.] */
    if (
        (destination == NULL) ||
        (destinationSize < 2) /*because the smallest number is '0\0' which requires 2 characters*/
        )
    {
        result = MU_FAILURE;
    }
    else
    {
        pos = 0;
        do
        {
            destination[pos++] = '0' + (value % 10);
            value /= 10;
        } while ((value > 0) && (pos < (destinationSize - 1)));

        if (value == 0)
        {
            size_t w;
            destination[pos] = '\0';
            /*all converted and they fit*/
            for (w = 0; w <= (pos - 1) >> 1; w++)
            {
                char temp;
                temp = destination[w];
                destination[w] = destination[pos - 1 - w];
                destination[pos - 1 - w] = temp;
            }
            /*Codes_SRS_CRT_ABSTRACTIONS_02_004: [If the conversion has been successfull then unsignedIntToString shall return 0.] */
            result = 0;
        }
        else
        {
            /*Codes_SRS_CRT_ABSTRACTIONS_02_002: [If the conversion fails for any reason (for example, insufficient buffer space), a non-zero return value shall be supplied and unsignedIntToString shall fail.] */
            result = MU_FAILURE;
        }
    }
    return result;
}